

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookptravltree.h
# Opt level: O3

Node * cookmem::PtrAVLTree::balance(Node **stack,int16_t depth)

{
  Node *pNVar1;
  Node *pNVar2;
  short sVar3;
  Node *pNVar4;
  Node *pNVar5;
  int16_t iVar6;
  int16_t iVar7;
  short sVar8;
  bool bVar9;
  
  do {
    while( true ) {
      depth = depth + -1;
      pNVar1 = stack[depth];
      pNVar4 = pNVar1->left;
      pNVar5 = pNVar1->right;
      sVar8 = pNVar1->height;
      if (pNVar4 == (Node *)0x0) {
        iVar6 = 0;
      }
      else {
        iVar6 = pNVar4->height;
      }
      if (pNVar5 == (Node *)0x0) {
        iVar7 = 0;
      }
      else {
        iVar7 = pNVar5->height;
      }
      if ((short)(iVar6 - iVar7) < 2) break;
      if (pNVar4->left == (Node *)0x0) {
        pNVar5 = pNVar4->right;
        sVar8 = 0;
        if (pNVar5 != (Node *)0x0) goto LAB_001027a8;
        pNVar5 = (Node *)0x0;
LAB_00102928:
        pNVar1->left = pNVar5;
        pNVar4->right = pNVar1;
        if (pNVar1->right == (Node *)0x0) {
          iVar6 = 0;
        }
        else {
          iVar6 = pNVar1->right->height;
        }
        if (iVar6 < sVar8) {
          iVar6 = sVar8;
        }
        sVar8 = iVar6 + 1;
        pNVar1->height = sVar8;
        if (pNVar4->left == (Node *)0x0) {
          sVar3 = 0;
        }
        else {
          sVar3 = pNVar4->left->height;
        }
        if (sVar8 < sVar3) {
          sVar8 = sVar3;
        }
        pNVar4->height = sVar8 + 1;
      }
      else {
        sVar8 = pNVar4->left->height;
        pNVar5 = pNVar4->right;
        if (pNVar5 == (Node *)0x0) {
          pNVar5 = (Node *)0x0;
          bVar9 = -1 < sVar8;
          sVar8 = 0;
          if (bVar9) goto LAB_00102928;
        }
        else {
LAB_001027a8:
          bVar9 = pNVar5->height <= sVar8;
          sVar8 = pNVar5->height;
          if (bVar9) goto LAB_00102928;
        }
        pNVar2 = pNVar5->left;
        pNVar4->right = pNVar2;
        pNVar5->left = pNVar4;
        if (pNVar4->left == (Node *)0x0) {
          iVar6 = 0;
        }
        else {
          iVar6 = pNVar4->left->height;
        }
        if (pNVar2 == (Node *)0x0) {
          iVar7 = 0;
        }
        else {
          iVar7 = pNVar2->height;
        }
        if (iVar7 < iVar6) {
          iVar7 = iVar6;
        }
        sVar8 = iVar7 + 1;
        pNVar4->height = sVar8;
        pNVar4 = pNVar5->right;
        if (pNVar4 == (Node *)0x0) {
          iVar6 = 0;
          sVar3 = 0;
          if (0 < sVar8) {
            sVar3 = sVar8;
          }
          pNVar5->height = sVar3 + 1;
        }
        else {
          sVar3 = (short)*(undefined4 *)&pNVar4->height;
          if (sVar8 <= sVar3) {
            sVar8 = sVar3;
          }
          pNVar5->height = sVar8 + 1;
          iVar6 = pNVar4->height;
        }
        pNVar1->left = pNVar4;
        pNVar5->right = pNVar1;
        if (pNVar1->right == (Node *)0x0) {
          iVar7 = 0;
        }
        else {
          iVar7 = pNVar1->right->height;
        }
        if (iVar7 < iVar6) {
          iVar7 = iVar6;
        }
        sVar8 = iVar7 + 1;
        pNVar1->height = sVar8;
        if (pNVar5->left == (Node *)0x0) {
          sVar3 = 0;
        }
        else {
          sVar3 = pNVar5->left->height;
        }
        if (sVar8 < sVar3) {
          sVar8 = sVar3;
        }
        pNVar5->height = sVar8 + 1;
        pNVar4 = pNVar5;
      }
LAB_00102a64:
      if (depth == 0) {
        return pNVar4;
      }
      (&stack[(long)depth + -1]->left)[stack[(long)depth + -1]->size <= pNVar4->size] = pNVar4;
    }
    if ((short)(iVar6 - iVar7) < -1) {
      if (pNVar5->right == (Node *)0x0) {
        iVar6 = 0;
      }
      else {
        iVar6 = pNVar5->right->height;
      }
      pNVar4 = pNVar5->left;
      if (pNVar4 == (Node *)0x0) {
        iVar7 = 0;
      }
      else {
        iVar7 = pNVar4->height;
      }
      if (iVar6 < iVar7) {
        pNVar2 = pNVar4->right;
        pNVar5->left = pNVar2;
        pNVar4->right = pNVar5;
        if (pNVar2 == (Node *)0x0) {
          iVar6 = 0;
        }
        else {
          iVar6 = pNVar2->height;
        }
        if (pNVar5->right == (Node *)0x0) {
          iVar7 = 0;
        }
        else {
          iVar7 = pNVar5->right->height;
        }
        if (iVar7 < iVar6) {
          iVar7 = iVar6;
        }
        sVar8 = iVar7 + 1;
        pNVar5->height = sVar8;
        pNVar5 = pNVar4->left;
        if (pNVar5 == (Node *)0x0) {
          iVar6 = 0;
        }
        else {
          iVar6 = pNVar5->height;
        }
        if (sVar8 < iVar6) {
          sVar8 = iVar6;
        }
        pNVar4->height = sVar8 + 1;
        pNVar1->right = pNVar5;
        pNVar4->left = pNVar1;
        if (pNVar1->left == (Node *)0x0) {
          iVar6 = 0;
        }
        else {
          iVar6 = pNVar1->left->height;
        }
        if (pNVar5 == (Node *)0x0) {
          iVar7 = 0;
        }
        else {
          iVar7 = pNVar5->height;
        }
        if (iVar7 < iVar6) {
          iVar7 = iVar6;
        }
        sVar8 = iVar7 + 1;
        pNVar1->height = sVar8;
        if (pNVar4->right == (Node *)0x0) {
          sVar3 = 0;
        }
        else {
          sVar3 = pNVar4->right->height;
        }
        if (sVar3 < sVar8) {
          sVar3 = sVar8;
        }
        pNVar4->height = sVar3 + 1;
      }
      else {
        pNVar1->right = pNVar4;
        pNVar5->left = pNVar1;
        if (pNVar1->left == (Node *)0x0) {
          iVar6 = 0;
        }
        else {
          iVar6 = pNVar1->left->height;
        }
        if (pNVar4 == (Node *)0x0) {
          iVar7 = 0;
        }
        else {
          iVar7 = pNVar4->height;
        }
        if (iVar7 < iVar6) {
          iVar7 = iVar6;
        }
        sVar8 = iVar7 + 1;
        pNVar1->height = sVar8;
        if (pNVar5->right == (Node *)0x0) {
          sVar3 = 0;
        }
        else {
          sVar3 = pNVar5->right->height;
        }
        if (sVar3 < sVar8) {
          sVar3 = sVar8;
        }
        pNVar5->height = sVar3 + 1;
        pNVar4 = pNVar5;
      }
      goto LAB_00102a64;
    }
    if (pNVar4 == (Node *)0x0) {
      iVar6 = 0;
    }
    else {
      iVar6 = pNVar4->height;
    }
    if (pNVar5 == (Node *)0x0) {
      iVar7 = 0;
    }
    else {
      iVar7 = pNVar5->height;
    }
    if (iVar7 < iVar6) {
      iVar7 = iVar6;
    }
    pNVar1->height = iVar7 + 1;
    if (depth == 0) {
      return pNVar1;
    }
    if (sVar8 == (short)(iVar7 + 1)) {
      return (Node *)0x0;
    }
  } while( true );
}

Assistant:

inline static Node*
    balance (Node** stack, std::int16_t depth)
    {
        for (;;)
        {
            --depth;
            Node* root = stack[depth];
            Node* left = root->left;
            Node* right = root->right;

            std::int16_t oldHeight = root->height;
            int16_t diff = getHeight (left) - getHeight (right);
            if (diff > 1)
            {
                if (getHeight (left->left) >= getHeight (left->right))
                {
                    root = rotateWithLeftChild (root);
                }
                else
                {
                    root = doubleWithLeftChild (root);
                }
                // update the parent
                if (depth == 0)
                {
                    return root;
                }
                setParent (root, stack[depth - 1]);
                continue;
            }
            else if (diff < -1)
            {
                if (getHeight (right->right) >= getHeight (right->left))
                {
                    root = rotateWithRightChild (root);
                }
                else
                {
                    root = doubleWithRightChild (root);
                }
                // update the parent
                if (depth == 0)
                {
                    return root;
                }
                setParent (root, stack[depth - 1]);
                continue;
            }
            else
            {
                updateHeight (root);
            }

            if (depth == 0)
            {
                return root;
            }

            if (oldHeight == root->height)
                break;
        }
        return nullptr;
    }